

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

bool __thiscall QListView::isIndexHidden(QListView *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QListViewPrivate *pQVar4;
  QModelIndex *in_RSI;
  QListViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QListViewPrivate *d;
  QPersistentModelIndex *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  uint7 in_stack_ffffffffffffffc0;
  bool bVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QListView *)0x87f3ba);
  QModelIndex::row(in_RSI);
  bVar2 = QListViewPrivate::isHidden(in_RDI,(int)((ulong)in_RSI >> 0x20));
  bVar5 = false;
  if (bVar2) {
    QModelIndex::parent((QModelIndex *)(ulong)in_stack_ffffffffffffffc0);
    bVar2 = ::operator==((QModelIndex *)
                         CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8);
    bVar5 = false;
    if (bVar2) {
      iVar3 = QModelIndex::column(in_RSI);
      bVar5 = iVar3 == pQVar4->column;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QListView::isIndexHidden(const QModelIndex &index) const
{
    Q_D(const QListView);
    return (d->isHidden(index.row())
            && (index.parent() == d->root)
            && index.column() == d->column);
}